

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void MergeUVRow_16_C(uint16_t *src_u,uint16_t *src_v,uint16_t *dst_uv,int scale,int width)

{
  uint uVar1;
  short sVar2;
  long lVar3;
  ulong uVar4;
  
  uVar1 = width - 1;
  sVar2 = (short)scale;
  if (1 < width) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      dst_uv[uVar4 * 2] = src_u[uVar4] * sVar2;
      dst_uv[uVar4 * 2 + 1] = src_v[uVar4] * sVar2;
      dst_uv[uVar4 * 2 + 2] = src_u[uVar4 + 1] * sVar2;
      dst_uv[uVar4 * 2 + 3] = src_v[uVar4 + 1] * sVar2;
      uVar4 = uVar4 + 2;
      lVar3 = lVar3 + 8;
    } while (uVar4 < uVar1);
    dst_uv = (uint16_t *)((long)dst_uv + lVar3);
  }
  if ((width & 1U) != 0) {
    *dst_uv = src_u[(int)uVar1] * sVar2;
    dst_uv[1] = sVar2 * src_v[(int)uVar1];
  }
  return;
}

Assistant:

void MergeUVRow_16_C(const uint16_t* src_u,
                     const uint16_t* src_v,
                     uint16_t* dst_uv,
                     int scale,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_uv[0] = src_u[x] * scale;
    dst_uv[1] = src_v[x] * scale;
    dst_uv[2] = src_u[x + 1] * scale;
    dst_uv[3] = src_v[x + 1] * scale;
    dst_uv += 4;
  }
  if (width & 1) {
    dst_uv[0] = src_u[width - 1] * scale;
    dst_uv[1] = src_v[width - 1] * scale;
  }
}